

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_type.hpp
# Opt level: O0

string * cpptrace::detail::exception_type_name_abi_cxx11_(void)

{
  char *__s;
  string *in_RDI;
  allocator<char> local_4e;
  byte local_4d;
  byte local_3a;
  allocator<char> local_39;
  string local_38;
  type_info *local_18;
  type_info *t;
  
  local_18 = (type_info *)__cxa_current_exception_type();
  local_3a = 0;
  local_4d = 0;
  if (local_18 == (type_info *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"<unknown>",&local_4e);
    std::allocator<char>::~allocator(&local_4e);
  }
  else {
    __s = std::type_info::name(local_18);
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
    local_4d = 1;
    demangle(in_RDI,&local_38);
  }
  if ((local_4d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator(&local_39);
  }
  return in_RDI;
}

Assistant:

inline std::string exception_type_name() {
        #if defined(CPPTRACE_HAS_CXX_EXCEPTION_TYPE) && (IS_LIBSTDCXX || IS_LIBCXX)
         const std::type_info* t = abi::__cxa_current_exception_type();
         return t ? detail::demangle(t->name()) : "<unknown>";
        #else
         return "<unknown>";
        #endif
    }